

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::internal::linked_ptr_internal::join(linked_ptr_internal *this,linked_ptr_internal *ptr)

{
  long *in_RSI;
  MutexBase *in_RDI;
  linked_ptr_internal *p;
  MutexLock lock;
  GTestMutexLock *in_stack_ffffffffffffffe0;
  long *plVar1;
  
  GTestMutexLock::GTestMutexLock(in_stack_ffffffffffffffe0,in_RDI);
  for (plVar1 = in_RSI; (long *)*plVar1 != in_RSI; plVar1 = (long *)*plVar1) {
  }
  *plVar1 = (long)in_RDI;
  *(long **)&in_RDI->mutex_ = in_RSI;
  GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x13e73e);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_linked_ptr_mutex) {
    MutexLock lock(&g_linked_ptr_mutex);

    linked_ptr_internal const* p = ptr;
    while (p->next_ != ptr) p = p->next_;
    p->next_ = this;
    next_ = ptr;
  }